

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_trust_anchors_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t extraout_RDX;
  ptrdiff_t _Num;
  Span<const_unsigned_char> in;
  CBS child;
  CBS local_40;
  
  if (contents == (CBS *)0x0) {
    bVar1 = true;
  }
  else {
    uVar2 = ssl_protocol_version(hs->ssl);
    if (uVar2 < 0x304) {
      bVar1 = false;
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaa0);
      *out_alert = 'n';
    }
    else {
      iVar3 = CBS_get_u16_length_prefixed(contents,&local_40);
      if (((iVar3 != 0) && ((uchar *)local_40.len != (uchar *)0x0)) &&
         (in.size_ = extraout_RDX, in.data_ = (uchar *)local_40.len,
         bVar1 = ssl_is_valid_trust_anchor_list((bssl *)local_40.data,in), bVar1)) {
        bVar1 = Array<unsigned_char>::InitUninitialized
                          (&hs->peer_available_trust_anchors,local_40.len);
        if ((uchar *)local_40.len != (uchar *)0x0 && bVar1) {
          memmove((hs->peer_available_trust_anchors).data_,local_40.data,local_40.len);
        }
        if (bVar1) {
          return true;
        }
        *out_alert = 'P';
        return false;
      }
      *out_alert = '2';
      bVar1 = false;
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaab);
    }
  }
  return bVar1;
}

Assistant:

static bool ext_trust_anchors_parse_serverhello(SSL_HANDSHAKE *hs,
                                                uint8_t *out_alert,
                                                CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  if (ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    return false;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(contents, &child) ||
      // The list of available trust anchors may not be empty.
      CBS_len(&child) == 0 ||  //
      !ssl_is_valid_trust_anchor_list(child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (!hs->peer_available_trust_anchors.CopyFrom(child)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }
  return true;
}